

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::CheckDirectory(cmFindPackageCommand *this,string *dir)

{
  undefined8 uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  undefined1 local_40 [8];
  string d;
  string *dir_local;
  cmFindPackageCommand *this_local;
  
  d.field_2._8_8_ = dir;
  uVar2 = std::__cxx11::string::empty();
  bVar4 = false;
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::back();
    bVar4 = *pcVar3 == '/';
  }
  uVar1 = d.field_2._8_8_;
  if (bVar4) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_40,uVar1);
    bVar4 = FindConfigFile(this,(string *)local_40,&this->FileFound);
    if (bVar4) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this->FileFound);
    }
    std::__cxx11::string::~string((string *)local_40);
    return bVar4;
  }
  __assert_fail("!dir.empty() && dir.back() == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFindPackageCommand.cxx"
                ,0x5d1,"bool cmFindPackageCommand::CheckDirectory(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::CheckDirectory(std::string const& dir)
{
  assert(!dir.empty() && dir.back() == '/');

  // Look for the file in this directory.
  std::string d = dir.substr(0, dir.size() - 1);
  if (this->FindConfigFile(d, this->FileFound)) {
    // Remove duplicate slashes.
    cmSystemTools::ConvertToUnixSlashes(this->FileFound);
    return true;
  }
  return false;
}